

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O1

bool __thiscall
Imf_3_4::IDManifest::ChannelGroupManifest::operator==
          (ChannelGroupManifest *this,ChannelGroupManifest *other)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  size_t __n;
  bool bVar4;
  int iVar5;
  
  if (this->_lifeTime == other->_lifeTime) {
    pbVar1 = (this->_components).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (this->_components).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar3 = (other->_components).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((((long)pbVar2 - (long)pbVar1 ==
          (long)(other->_components).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3) &&
        (bVar4 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                           (pbVar1,pbVar2,pbVar3), bVar4)) &&
       (__n = (this->_hashScheme)._M_string_length, __n == (other->_hashScheme)._M_string_length)) {
      if ((__n != 0) &&
         (iVar5 = bcmp((this->_hashScheme)._M_dataplus._M_p,(other->_hashScheme)._M_dataplus._M_p,
                       __n), iVar5 != 0)) {
        return false;
      }
      pbVar1 = (this->_components).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (this->_components).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar3 = (other->_components).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((((long)pbVar2 - (long)pbVar1 ==
            (long)(other->_components).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3) &&
          (bVar4 = std::__equal<false>::
                   equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                             (pbVar1,pbVar2,pbVar3), bVar4)) &&
         ((this->_table)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
          (other->_table)._M_t._M_impl.super__Rb_tree_header._M_node_count)) {
        bVar4 = std::__equal<false>::
                equal<std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                          ((this->_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                           (_Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            )&(this->_table)._M_t._M_impl.super__Rb_tree_header,
                           (other->_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
        return bVar4;
      }
    }
  }
  return false;
}

Assistant:

bool
IDManifest::ChannelGroupManifest::operator== (
    const IDManifest::ChannelGroupManifest& other) const
{
    return (
        _lifeTime == other._lifeTime && _components == other._components &&
        _hashScheme == other._hashScheme && _components == other._components &&
        _table == other._table);
}